

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::PrintFieldDescriptor
          (Generator *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  Printer *this_00;
  bool bVar1;
  int x;
  Type e;
  CppType e_00;
  FieldOptions *this_01;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar2;
  char *pcVar3;
  char *pcVar4;
  int __c;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  AlphaNum *a_02;
  FieldDescriptor *field_00;
  AlphaNum *a_03;
  AlphaNum *a_04;
  AlphaNum *a_05;
  string *__s;
  AlphaNum *in_R8;
  string_view serialized_options;
  string_view local_608;
  char local_5f8 [8];
  char field_descriptor_decl [455];
  AlphaNum local_428;
  string local_3f8;
  AlphaNum local_3d8;
  string local_3a8;
  AlphaNum local_388;
  string local_358;
  byte local_332;
  allocator<char> local_331;
  AlphaNum local_330;
  string_view local_300;
  AlphaNum local_2f0;
  AlphaNum local_2c0;
  string local_290;
  undefined1 local_270 [16];
  string local_260;
  string local_240;
  AlphaNum local_220;
  string local_1f0;
  AlphaNum local_1d0;
  string local_1a0;
  AlphaNum local_180;
  string local_150;
  AlphaNum local_130;
  string local_100;
  allocator<char> local_d9;
  string_view local_d8;
  string local_c8 [39];
  allocator<char> local_a1;
  string_view local_a0;
  string local_90 [32];
  undefined1 local_70 [8];
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  undefined1 local_40 [8];
  string options_string;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *field_local;
  Generator *this_local;
  
  options_string.field_2._8_8_ = proto;
  std::__cxx11::string::string((string *)local_40);
  this_01 = FieldDescriptorProto::options((FieldDescriptorProto *)options_string.field_2._8_8_);
  MessageLite::SerializeToString((MessageLite *)this_01,(string *)local_40);
  absl::lts_20250127::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_70);
  local_a0 = FieldDescriptor::name(field);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_90,&local_a0,&local_a1);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[5],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)local_70,(key_arg<char[5]> *)0xc259cc);
  std::__cxx11::string::operator=((string *)pbVar2,local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_a1);
  local_d8 = FieldDescriptor::full_name(field);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_c8,&local_d8,&local_d9);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[10],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)local_70,(key_arg<char[10]> *)0xb93fb9);
  __s = local_c8;
  std::__cxx11::string::operator=((string *)pbVar2,local_c8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_d9);
  pcVar3 = FieldDescriptor::index(field,(char *)__s,__c);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_130,(int)pcVar3);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_100,(lts_20250127 *)&local_130,a);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[6],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)local_70,(key_arg<char[6]> *)0x99e6cf);
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  x = FieldDescriptor::number(field);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_180,x);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_150,(lts_20250127 *)&local_180,a_00);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[7],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)local_70,(key_arg<char[7]> *)0xbe447d);
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  e = FieldDescriptor::type(field);
  absl::lts_20250127::AlphaNum::AlphaNum<google::protobuf::internal::FieldDescriptorLite::Type,void>
            (&local_1d0,e);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_1a0,(lts_20250127 *)&local_1d0,a_01);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[5],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)local_70,(key_arg<char[5]> *)0xbe040e);
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  e_00 = FieldDescriptor::cpp_type(field);
  absl::lts_20250127::AlphaNum::
  AlphaNum<google::protobuf::internal::FieldDescriptorLite::CppType,void>(&local_220,e_00);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_1f0,(lts_20250127 *)&local_220,a_02);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[9],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)local_70,(key_arg<char[9]> *)"cpp_type");
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  bVar1 = FieldDescriptor::has_default_value(field);
  pcVar3 = "False";
  if (bVar1) {
    pcVar3 = "True";
  }
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[18],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)local_70,(key_arg<char[18]> *)"has_default_value");
  std::__cxx11::string::operator=((string *)pbVar2,pcVar3);
  python::(anonymous_namespace)::StringifyDefaultValue_abi_cxx11_
            (&local_240,(_anonymous_namespace_ *)field,field_00);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[14],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)local_70,(key_arg<char[14]> *)0xb940c7);
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  bVar1 = FieldDescriptor::is_extension(field);
  pcVar4 = "True";
  pcVar3 = "False";
  if (bVar1) {
    pcVar3 = "True";
  }
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[13],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)local_70,(key_arg<char[13]> *)0xc2572b);
  std::__cxx11::string::operator=((string *)pbVar2,pcVar3);
  local_270 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
  serialized_options._M_len = local_270._8_8_;
  serialized_options._M_str = pcVar4;
  python::(anonymous_namespace)::OptionsValue_abi_cxx11_
            (&local_260,local_270._0_8_,serialized_options);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[19],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)local_70,(key_arg<char[19]> *)"serialized_options");
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  local_332 = 0;
  bVar1 = FieldDescriptor::has_json_name(field);
  if (bVar1) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_2c0,", json_name=\'");
    local_300 = FieldDescriptor::json_name(field);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_2f0,local_300);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_330,"\'");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_290,(lts_20250127 *)&local_2c0,&local_2f0,&local_330,in_R8);
  }
  else {
    std::allocator<char>::allocator();
    local_332 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"",&local_331);
  }
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[10],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)local_70,(key_arg<char[10]> *)0xb940fa);
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  if ((local_332 & 1) != 0) {
    std::allocator<char>::~allocator(&local_331);
  }
  bVar1 = FieldDescriptor::is_required(field);
  if (bVar1) {
    absl::lts_20250127::AlphaNum::
    AlphaNum<google::protobuf::internal::FieldDescriptorLite::Label,void>(&local_388,LABEL_REQUIRED)
    ;
    absl::lts_20250127::StrCat_abi_cxx11_(&local_358,(lts_20250127 *)&local_388,a_03);
    pbVar2 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[6],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)local_70,(key_arg<char[6]> *)"label");
    std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_358);
    std::__cxx11::string::~string((string *)&local_358);
  }
  else {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      absl::lts_20250127::AlphaNum::
      AlphaNum<google::protobuf::internal::FieldDescriptorLite::Label,void>
                (&local_3d8,LABEL_REPEATED);
      absl::lts_20250127::StrCat_abi_cxx11_(&local_3a8,(lts_20250127 *)&local_3d8,a_04);
      pbVar2 = absl::lts_20250127::container_internal::
               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
               ::
               operator[]<char[6],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                         ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                           *)local_70,(key_arg<char[6]> *)"label");
      std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_3a8);
    }
    else {
      absl::lts_20250127::AlphaNum::
      AlphaNum<google::protobuf::internal::FieldDescriptorLite::Label,void>
                (&local_428,LABEL_OPTIONAL);
      absl::lts_20250127::StrCat_abi_cxx11_(&local_3f8,(lts_20250127 *)&local_428,a_05);
      pbVar2 = absl::lts_20250127::container_internal::
               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
               ::
               operator[]<char[6],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                         ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                           *)local_70,(key_arg<char[6]> *)"label");
      std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_3f8);
    }
  }
  memcpy(local_5f8,
         "_descriptor.FieldDescriptor(\n  name=\'$name$\', full_name=\'$full_name$\', index=$index$,\n  number=$number$, type=$type$, cpp_type=$cpp_type$, label=$label$,\n  has_default_value=$has_default_value$, default_value=$default_value$,\n  message_type=None, enum_type=None, containing_type=None,\n  is_extension=$is_extension$, extension_scope=None,\n  serialized_options=$serialized_options$$json_name$, file=DESCRIPTOR,  create_key=_descriptor._internal_create_key)"
         ,0x1c7);
  this_00 = this->printer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_608,local_5f8);
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (this_00,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_70,local_608);
  absl::lts_20250127::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_70);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void Generator::PrintFieldDescriptor(const FieldDescriptor& field,
                                     const FieldDescriptorProto& proto) const {
  std::string options_string;
  proto.options().SerializeToString(&options_string);
  absl::flat_hash_map<absl::string_view, std::string> m;
  m["name"] = std::string(field.name());
  m["full_name"] = std::string(field.full_name());
  m["index"] = absl::StrCat(field.index());
  m["number"] = absl::StrCat(field.number());
  m["type"] = absl::StrCat(field.type());
  m["cpp_type"] = absl::StrCat(field.cpp_type());
  m["has_default_value"] = field.has_default_value() ? "True" : "False";
  m["default_value"] = StringifyDefaultValue(field);
  m["is_extension"] = field.is_extension() ? "True" : "False";
  m["serialized_options"] = OptionsValue(options_string);
  m["json_name"] = field.has_json_name()
                       ? absl::StrCat(", json_name='", field.json_name(), "'")
                       : "";
  if (field.is_required()) {
    m["label"] = absl::StrCat(FieldDescriptor::Label::LABEL_REQUIRED);
  } else if (field.is_repeated()) {
    m["label"] = absl::StrCat(FieldDescriptor::Label::LABEL_REPEATED);
  } else {
    m["label"] = absl::StrCat(FieldDescriptor::Label::LABEL_OPTIONAL);
  }
  // We always set message_type and enum_type to None at this point, and then
  // these fields in correctly after all referenced descriptors have been
  // defined and/or imported (see FixForeignFieldsInDescriptors()).
  const char field_descriptor_decl[] =
      "_descriptor.FieldDescriptor(\n"
      "  name='$name$', full_name='$full_name$', index=$index$,\n"
      "  number=$number$, type=$type$, cpp_type=$cpp_type$, label=$label$,\n"
      "  has_default_value=$has_default_value$, "
      "default_value=$default_value$,\n"
      "  message_type=None, enum_type=None, containing_type=None,\n"
      "  is_extension=$is_extension$, extension_scope=None,\n"
      "  serialized_options=$serialized_options$$json_name$, file=DESCRIPTOR,"
      "  create_key=_descriptor._internal_create_key)";
  printer_->Print(m, field_descriptor_decl);
}